

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestSessionExecutor.cpp
# Opt level: O2

void __thiscall
tcu::TestSessionExecutor::enterTestPackage(TestSessionExecutor *this,TestPackage *testPackage)

{
  undefined1 auVar1 [16];
  ulong in_stack_fffffffffffffff0;
  
  (*(testPackage->super_TestNode)._vptr_TestNode[5])(testPackage);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_stack_fffffffffffffff0;
  de::details::UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>::
  assignData(&(this->m_caseExecutor).
              super_UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>,
             (PtrData<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>)
             (auVar1 << 0x40));
  de::details::UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>::
  ~UniqueBase((UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_> *)
              &stack0xffffffffffffffe8);
  return;
}

Assistant:

void TestSessionExecutor::enterTestPackage (TestPackage* testPackage)
{
	// Create test case wrapper
	DE_ASSERT(!m_caseExecutor);
	m_caseExecutor = de::MovePtr<TestCaseExecutor>(testPackage->createExecutor());
}